

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparc.c
# Opt level: O1

int main(void)

{
  arm_cpsmode_type aVar1;
  arm_cpsflag_type aVar2;
  uint8_t *buffer;
  cs_detail *pcVar3;
  cs_err cVar4;
  size_t count;
  char *pcVar5;
  size_t len;
  size_t len_00;
  long lVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  arm_cc *paVar10;
  cs_insn *insn;
  cs_insn *local_48;
  uchar *local_40;
  long local_38;
  
  lVar6 = 0;
  do {
    cVar4 = cs_open((&DAT_00264330)[lVar6 * 8],(&DAT_00264334)[lVar6 * 8],&handle);
    if (cVar4 == CS_ERR_OK) {
      local_38 = lVar6;
      cs_option(handle,CS_OPT_DETAIL,3);
      buffer = (&PTR_anon_var_dwarf_27_00264338)[lVar6 * 4];
      local_40 = (uchar *)(&DAT_00264340)[lVar6 * 4];
      count = cs_disasm(handle,buffer,(size_t)local_40,0x1000,0,&local_48);
      if (count == 0) {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00264348)[lVar6 * 4]);
        print_string_hex((char *)buffer,local_40,len_00);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00264348)[lVar6 * 4]);
        print_string_hex((char *)buffer,local_40,len);
        puts("Disasm:");
        sVar9 = 0;
        do {
          printf("0x%lx:\t%s\t%s\n",local_48[sVar9].address,local_48[sVar9].mnemonic,
                 local_48[sVar9].op_str);
          pcVar3 = local_48[sVar9].detail;
          if (pcVar3 != (cs_detail *)0x0) {
            if ((pcVar3->field_6).x86.rex != '\0') {
              printf("\top_count: %u\n");
            }
            if ((pcVar3->field_6).x86.rex != '\0') {
              paVar10 = &(pcVar3->field_6).arm.cc;
              uVar7 = 0;
              do {
                aVar1 = paVar10[-2];
                if (aVar1 == ARM_CPSMODE_ID) {
                  printf("\t\toperands[%u].type: MEM\n",uVar7 & 0xffffffff);
                  if ((char)paVar10[-1] != ARM_CPSFLAG_INVALID) {
                    pcVar5 = cs_reg_name(handle,(uint)(byte)(char)paVar10[-1]);
                    printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar7 & 0xffffffff,pcVar5);
                  }
                  if (*(byte *)((long)paVar10 + -3) != 0) {
                    pcVar5 = cs_reg_name(handle,(uint)*(byte *)((long)paVar10 + -3));
                    printf("\t\t\toperands[%u].mem.index: REG = %s\n",uVar7 & 0xffffffff,pcVar5);
                  }
                  aVar2 = *paVar10;
                  if (aVar2 != ARM_CPSFLAG_INVALID) {
                    pcVar5 = "\t\t\toperands[%u].mem.disp: 0x%x\n";
                    goto LAB_0014342c;
                  }
                }
                else if (aVar1 == ARM_CPSMODE_IE) {
                  aVar2 = paVar10[-1];
                  pcVar5 = "\t\toperands[%u].type: IMM = 0x%x\n";
LAB_0014342c:
                  printf(pcVar5,uVar7 & 0xffffffff,(ulong)aVar2);
                }
                else if (aVar1 == 1) {
                  pcVar5 = cs_reg_name(handle,paVar10[-1]);
                  printf("\t\toperands[%u].type: REG = %s\n",uVar7 & 0xffffffff,pcVar5);
                }
                uVar7 = uVar7 + 1;
                paVar10 = paVar10 + 3;
              } while (uVar7 < (pcVar3->field_6).x86.rex);
            }
            if ((pcVar3->field_6).arm64.cc != ARM64_CC_INVALID) {
              printf("\tCode condition: %u\n");
            }
            if ((pcVar3->field_6).arm.vector_size != 0) {
              printf("\tHint code: %u\n");
            }
            putchar(10);
          }
          sVar9 = sVar9 + 1;
        } while (sVar9 != count);
        printf("0x%lx:\n",(ulong)local_48[count - 1].size + local_48[count - 1].address);
        cs_free(local_48,count);
      }
      putchar(10);
      cs_close(&handle);
      lVar8 = local_38;
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar4);
      lVar8 = lVar6;
    }
    lVar6 = lVar8 + 1;
    if (lVar8 != 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
	test();

	return 0;
}